

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStringVectorAttribute.cpp
# Opt level: O2

void __thiscall
Imf_3_4::
TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::readValueFrom(TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *this,IStream *is,int size,int version)

{
  int iVar1;
  _Alloc_hider _Var2;
  InputExc *this_00;
  int iVar3;
  string str;
  
  iVar3 = 0;
  while( true ) {
    if (size <= iVar3) {
      return;
    }
    (*is->_vptr_IStream[3])(is,&str,4);
    _Var2 = str._M_dataplus;
    iVar1 = (int)str._M_dataplus._M_p;
    if (((int)str._M_dataplus._M_p < 0) || (size - (iVar3 + 4) < (int)str._M_dataplus._M_p)) break;
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)&str);
    if (0 < iVar1) {
      (*is->_vptr_IStream[3])(is,str._M_dataplus._M_p,(ulong)_Var2._M_p & 0xffffffff);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->_value,&str);
    iVar3 = iVar1 + iVar3 + 4;
    std::__cxx11::string::~string((string *)&str);
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(this_00,"Invalid size field reading stringvector attribute");
  __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

IMF_EXPORT void
StringVectorAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    int read = 0;

    while (read < size)
    {
        int strSize;
        Xdr::read<StreamIO> (is, strSize);
        read += Xdr::size<int> ();

        // check there is enough space remaining in attribute to
        // contain claimed string length
        if (strSize < 0 || strSize > size - read)
        {
            throw IEX_NAMESPACE::InputExc (
                "Invalid size field reading stringvector attribute");
        }

        std::string str;
        str.resize (strSize);

        if (strSize > 0) { Xdr::read<StreamIO> (is, &str[0], strSize); }

        read += strSize;

        _value.push_back (str);
    }
}